

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.hpp
# Opt level: O0

void yactfr::internal::TraceTypeImpl::setDispName<yactfr::VariantTypeOption<unsigned_long_long>>
               (VariantTypeOption<unsigned_long_long> *obj,string *name,bool removeUnderscore)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  string *psStack_18;
  bool removeUnderscore_local;
  string *name_local;
  VariantTypeOption<unsigned_long_long> *obj_local;
  
  local_19 = removeUnderscore;
  psStack_18 = name;
  name_local = (string *)obj;
  if ((removeUnderscore) && (pcVar1 = (char *)std::__cxx11::string::c_str(), *pcVar1 == '_')) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)psStack_18);
    boost::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&name_local[1]._M_string_length,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  boost::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&name_local[1]._M_string_length,psStack_18);
  return;
}

Assistant:

static void setDispName(const ObjT& obj, const std::string& name, const bool removeUnderscore)
    {
        if (removeUnderscore && name.c_str()[0] == '_') {
            obj._dispName = name.substr(1);
        } else {
            obj._dispName = name;
        }
    }